

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UBool isMatchAtCPBoundary(UChar *start,UChar *match,UChar *matchLimit,UChar *limit)

{
  UChar *limit_local;
  UChar *matchLimit_local;
  UChar *match_local;
  UChar *start_local;
  
  if ((((*match & 0xfc00U) == 0xdc00) && (start != match)) && ((match[-1] & 0xfc00U) == 0xd800)) {
    start_local._7_1_ = '\0';
  }
  else if ((((matchLimit[-1] & 0xfc00U) == 0xd800) && (match != limit)) &&
          ((*matchLimit & 0xfc00U) == 0xdc00)) {
    start_local._7_1_ = '\0';
  }
  else {
    start_local._7_1_ = '\x01';
  }
  return start_local._7_1_;
}

Assistant:

static inline UBool
isMatchAtCPBoundary(const UChar *start, const UChar *match, const UChar *matchLimit, const UChar *limit) {
    if(U16_IS_TRAIL(*match) && start!=match && U16_IS_LEAD(*(match-1))) {
        /* the leading edge of the match is in the middle of a surrogate pair */
        return FALSE;
    }
    if(U16_IS_LEAD(*(matchLimit-1)) && match!=limit && U16_IS_TRAIL(*matchLimit)) {
        /* the trailing edge of the match is in the middle of a surrogate pair */
        return FALSE;
    }
    return TRUE;
}